

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example2.cpp
# Opt level: O3

int main(void)

{
  undefined8 ******ppppppuVar1;
  double dVar2;
  undefined8 ******ppppppuVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  RTPPacket *p;
  ostream *poVar7;
  int *piVar8;
  int errcode;
  int errcode_00;
  int errcode_01;
  string *this;
  timespec tpMono;
  timespec tpMono_1;
  RTPTime delay;
  uint8_t silencebuffer [160];
  RTPSessionParams sessionparams;
  RTPSession session;
  string sStack_109e8;
  double dStack_109c8;
  timespec tStack_109c0;
  RTPTime RStack_109b0;
  string asStack_109a8 [5];
  RTPTransmissionParams RStack_10908;
  undefined8 uStack_108f8;
  undefined8 *****pppppuStack_108f0;
  undefined8 *****pppppuStack_108e8;
  undefined8 uStack_108e0;
  undefined1 uStack_108d8;
  undefined8 uStack_108d4;
  undefined8 uStack_108cc;
  undefined5 uStack_108c4;
  undefined3 uStack_108bf;
  undefined5 uStack_108bc;
  undefined8 uStack_108b0;
  RTPAddress RStack_108a8;
  undefined4 uStack_10898;
  RTPSessionParams RStack_10890;
  RTPSession RStack_107e8;
  
  this = &sStack_109e8;
  jrtplib::RTPSession::RTPSession(&RStack_107e8,(RTPRandom *)0x0,(RTPMemoryManager *)0x0);
  jrtplib::RTPSessionParams::RTPSessionParams(&RStack_10890);
  RStack_10890.owntsunit = 0.000125;
  RStack_10908.protocol = IPv4UDPProto;
  RStack_10908._vptr_RTPTransmissionParams = (_func_int **)&PTR__RTPUDPv4TransmissionParams_0013b060
  ;
  uStack_108e0 = 0;
  uStack_108f8 = 0;
  uStack_108d8 = 1;
  uStack_108d4 = 0x800000008000;
  uStack_108cc = 0x800000008000;
  uStack_108b0 = 0;
  uStack_108c4 = 0;
  uStack_108bf = 0;
  uStack_108bc = 0;
  RStack_10908._12_2_ = 8000;
  pppppuStack_108f0 = &pppppuStack_108f0;
  pppppuStack_108e8 = &pppppuStack_108f0;
  uVar5 = jrtplib::RTPSession::Create(&RStack_107e8,&RStack_10890,&RStack_10908,IPv4UDPProto);
  if ((int)uVar5 < 0) {
    jrtplib::RTPGetErrorString_abi_cxx11_(asStack_109a8,(jrtplib *)(ulong)uVar5,errcode);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,asStack_109a8[0]._M_dataplus._M_p,
                        asStack_109a8[0]._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    RStack_108a8.addresstype = IPv4Address;
    RStack_108a8._12_4_ = 0x7f000001;
    RStack_108a8._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_0013bd10;
    uStack_10898 = 0x23292328;
    uVar5 = jrtplib::RTPSession::AddDestination(&RStack_107e8,&RStack_108a8);
    if (-1 < (int)uVar5) {
      jrtplib::RTPSession::SetDefaultPayloadType(&RStack_107e8,'`');
      jrtplib::RTPSession::SetDefaultMark(&RStack_107e8,false);
      jrtplib::RTPSession::SetDefaultTimestampIncrement(&RStack_107e8,0xa0);
      memset(asStack_109a8,0x80,0xa0);
      RStack_109b0.m_t = 0.02;
      if (jrtplib::RTPTime::CurrentTime()::s_initialized == '\0') {
        jrtplib::RTPTime::CurrentTime()::s_initialized = '\x01';
        clock_gettime(0,(timespec *)&sStack_109e8);
        clock_gettime(1,&tStack_109c0);
        dStack_109c8 = (double)(long)sStack_109e8._M_string_length * 1e-09 +
                       (double)(long)sStack_109e8._M_dataplus._M_p;
        jrtplib::RTPTime::CurrentTime()::s_startOffet =
             dStack_109c8 - ((double)tStack_109c0.tv_nsec * 1e-09 + (double)tStack_109c0.tv_sec);
      }
      else {
        clock_gettime(1,(timespec *)&sStack_109e8);
        dStack_109c8 = (double)(long)sStack_109e8._M_string_length * 1e-09 +
                       (double)(long)sStack_109e8._M_dataplus._M_p +
                       jrtplib::RTPTime::CurrentTime()::s_startOffet;
      }
      while (uVar5 = jrtplib::RTPSession::SendPacket(&RStack_107e8,asStack_109a8,0xa0),
            -1 < (int)uVar5) {
        jrtplib::RTPSession::BeginDataAccess(&RStack_107e8);
        bVar4 = jrtplib::RTPSession::GotoFirstSource(&RStack_107e8);
        while (bVar4 != false) {
          while (p = jrtplib::RTPSession::GetNextPacket(&RStack_107e8), p != (RTPPacket *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"Got packet with ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"extended sequence number ",0x19);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," from SSRC ",0xb);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            jrtplib::RTPSession::DeletePacket(&RStack_107e8,p);
          }
          bVar4 = jrtplib::RTPSession::GotoNextSource(&RStack_107e8);
        }
        jrtplib::RTPSession::EndDataAccess(&RStack_107e8);
        sStack_109e8._M_dataplus._M_p = (char *)0x0;
        sStack_109e8._M_string_length = 20000000;
        do {
          iVar6 = nanosleep((timespec *)&sStack_109e8,&tStack_109c0);
          sStack_109e8._M_dataplus._M_p = (pointer)tStack_109c0.tv_sec;
          sStack_109e8._M_string_length = tStack_109c0.tv_nsec;
          if (iVar6 != -1) break;
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        if (jrtplib::RTPTime::CurrentTime()::s_initialized == '\0') {
          jrtplib::RTPTime::CurrentTime()::s_initialized = '\x01';
          clock_gettime(0,(timespec *)&sStack_109e8);
          clock_gettime(1,&tStack_109c0);
          dVar2 = (double)(long)sStack_109e8._M_string_length * 1e-09 +
                  (double)(long)sStack_109e8._M_dataplus._M_p;
          jrtplib::RTPTime::CurrentTime()::s_startOffet =
               dVar2 - ((double)tStack_109c0.tv_nsec * 1e-09 + (double)tStack_109c0.tv_sec);
        }
        else {
          clock_gettime(1,(timespec *)&sStack_109e8);
          dVar2 = (double)(long)sStack_109e8._M_string_length * 1e-09 +
                  (double)(long)sStack_109e8._M_dataplus._M_p +
                  jrtplib::RTPTime::CurrentTime()::s_startOffet;
        }
        if (60.0 < dVar2 - dStack_109c8) {
          RStack_109b0.m_t = 10.0;
          jrtplib::RTPSession::BYEDestroy(&RStack_107e8,&RStack_109b0,"Time\'s up",9);
          RStack_10908._vptr_RTPTransmissionParams =
               (_func_int **)&PTR__RTPUDPv4TransmissionParams_0013b060;
          ppppppuVar3 = (undefined8 ******)pppppuStack_108f0;
          while (ppppppuVar3 != &pppppuStack_108f0) {
            ppppppuVar1 = (undefined8 ******)*ppppppuVar3;
            operator_delete(ppppppuVar3,0x18);
            ppppppuVar3 = ppppppuVar1;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)RStack_10890.cname._M_dataplus._M_p != &RStack_10890.cname.field_2) {
            operator_delete(RStack_10890.cname._M_dataplus._M_p,
                            RStack_10890.cname.field_2._M_allocated_capacity + 1);
          }
          jrtplib::RTPSession::~RTPSession(&RStack_107e8);
          return 0;
        }
      }
      jrtplib::RTPGetErrorString_abi_cxx11_(&sStack_109e8,(jrtplib *)(ulong)uVar5,errcode_01);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,sStack_109e8._M_dataplus._M_p,
                          sStack_109e8._M_string_length);
      std::endl<char,std::char_traits<char>>(poVar7);
      goto LAB_00119cdc;
    }
    jrtplib::RTPGetErrorString_abi_cxx11_(asStack_109a8,(jrtplib *)(ulong)uVar5,errcode_00);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,asStack_109a8[0]._M_dataplus._M_p,
                        asStack_109a8[0]._M_string_length);
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  this = asStack_109a8;
LAB_00119cdc:
  std::__cxx11::string::~string((string *)this);
  exit(-1);
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
		
	RTPSession session;
	
	RTPSessionParams sessionparams;
	sessionparams.SetOwnTimestampUnit(1.0/8000.0);
			
	RTPUDPv4TransmissionParams transparams;
	transparams.SetPortbase(8000);
			
	int status = session.Create(sessionparams,&transparams);
	if (status < 0)
	{
		std::cerr << RTPGetErrorString(status) << std::endl;
		exit(-1);
	}
	
	uint8_t localip[]={127,0,0,1};
	RTPIPv4Address addr(localip,9000);
	
	status = session.AddDestination(addr);
	if (status < 0)
	{
		std::cerr << RTPGetErrorString(status) << std::endl;
		exit(-1);
	}
	
	session.SetDefaultPayloadType(96);
	session.SetDefaultMark(false);
	session.SetDefaultTimestampIncrement(160);
	
	uint8_t silencebuffer[160];
	for (int i = 0 ; i < 160 ; i++)
		silencebuffer[i] = 128;

	RTPTime delay(0.020);
	RTPTime starttime = RTPTime::CurrentTime();
	
	bool done = false;
	while (!done)
	{
		status = session.SendPacket(silencebuffer,160);
		if (status < 0)
		{
			std::cerr << RTPGetErrorString(status) << std::endl;
			exit(-1);
		}
		
		session.BeginDataAccess();
		if (session.GotoFirstSource())
		{
			do
			{
				RTPPacket *packet;

				while ((packet = session.GetNextPacket()) != 0)
				{
					std::cout << "Got packet with " 
					          << "extended sequence number " 
					          << packet->GetExtendedSequenceNumber() 
					          << " from SSRC " << packet->GetSSRC() 
					          << std::endl;
					session.DeletePacket(packet);
				}
			} while (session.GotoNextSource());
		}
		session.EndDataAccess();
			
		RTPTime::Wait(delay);
		
		RTPTime t = RTPTime::CurrentTime();
		t -= starttime;
		if (t > RTPTime(60.0))
			done = true;
	}
	
	delay = RTPTime(10.0);
	session.BYEDestroy(delay,"Time's up",9);
	
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}